

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser.cxx
# Opt level: O0

void __thiscall Fl_Browser::item_draw(Fl_Browser *this,void *item,int X,int Y,int W,int H)

{
  char *pcVar1;
  bool bVar2;
  char cVar3;
  char cVar4;
  int iVar5;
  Fl_Color bg;
  int *piVar6;
  long lVar7;
  bool bVar8;
  Fl_Align local_bc;
  uint local_64;
  Fl_Color local_60;
  Fl_Align talign;
  Fl_Color lcol;
  Fl_Font font;
  int tsize;
  int iconw;
  char *e;
  int w1;
  bool first;
  int *i;
  char *str;
  FL_BLINE *l;
  int H_local;
  int W_local;
  int Y_local;
  int X_local;
  void *item_local;
  Fl_Browser *this_local;
  
  i = (int *)((long)item + 0x23);
  str = (char *)item;
  l._0_4_ = H;
  l._4_4_ = W;
  H_local = Y;
  W_local = X;
  _Y_local = item;
  item_local = this;
  _w1 = column_widths(this);
  bVar2 = true;
LAB_001d471a:
  piVar6 = i;
  if (l._4_4_ < 7) {
    return;
  }
  e._0_4_ = l._4_4_;
  _tsize = (char *)0x0;
  if (*_w1 != 0) {
    cVar3 = column_char(this);
    _tsize = strchr((char *)piVar6,(int)cVar3);
    if (_tsize != (char *)0x0) {
      *_tsize = '\0';
      e._0_4_ = *_w1;
      _w1 = _w1 + 1;
    }
  }
  if ((bVar2) && (bVar2 = false, *(long *)(str + 0x18) != 0)) {
    Fl_Image::draw(*(Fl_Image **)(str + 0x18),W_local + 2,H_local + 1);
    iVar5 = Fl_Image::w(*(Fl_Image **)(str + 0x18));
    iVar5 = iVar5 + 2;
    W_local = iVar5 + W_local;
    l._4_4_ = l._4_4_ - iVar5;
    e._0_4_ = (int)e - iVar5;
  }
  lcol = textsize(this);
  talign = Fl_Browser_::textfont(&this->super_Fl_Browser_);
  local_60 = Fl_Browser_::textcolor(&this->super_Fl_Browser_);
  local_64 = 4;
  do {
    iVar5 = *i;
    cVar3 = format_char(this);
    bVar8 = false;
    if ((char)iVar5 == cVar3) {
      piVar6 = (int *)((long)i + 1);
      pcVar1 = (char *)((long)i + 1);
      bVar8 = false;
      i = piVar6;
      if (*pcVar1 != '\0') {
        cVar3 = *(char *)piVar6;
        cVar4 = format_char(this);
        bVar8 = cVar3 != cVar4;
      }
    }
    if (!bVar8) goto LAB_001d4ac4;
    piVar6 = (int *)((long)i + 1);
    switch((char)*i) {
    case '-':
      i = piVar6;
      fl_color(0x27);
      fl_line(W_local + 3,H_local + (int)l / 2,W_local + (int)e + -3,H_local + (int)l / 2);
      fl_color(0x36);
      fl_line(W_local + 3,H_local + (int)l / 2 + 1,W_local + (int)e + -3,H_local + (int)l / 2 + 1);
      piVar6 = i;
      break;
    case '.':
      goto switchD_001d48b3_caseD_2e;
    case '@':
      goto LAB_001d4ac4;
    case 'B':
      i = piVar6;
      if ((str[0x22] & 1U) == 0) {
        lVar7 = strtol((char *)piVar6,(char **)&i,10);
        fl_color((Fl_Color)lVar7);
        fl_rectf(W_local,H_local,(int)e,(int)l);
        piVar6 = i;
      }
      else {
        while (iVar5 = isdigit((uint)(byte)*i), piVar6 = i, iVar5 != 0) {
          i = (int *)((long)i + 1);
        }
      }
      break;
    case 'C':
      i = piVar6;
      lVar7 = strtol((char *)piVar6,(char **)&i,10);
      local_60 = (Fl_Color)lVar7;
      piVar6 = i;
      break;
    case 'F':
      i = piVar6;
      lVar7 = strtol((char *)piVar6,(char **)&i,10);
      talign = (Fl_Align)lVar7;
      piVar6 = i;
      break;
    case 'L':
    case 'l':
      lcol = 0x18;
      break;
    case 'M':
    case 'm':
      lcol = 0x12;
      break;
    case 'N':
      local_60 = 8;
      break;
    case 'S':
      i = piVar6;
      lVar7 = strtol((char *)piVar6,(char **)&i,10);
      lcol = (Fl_Color)lVar7;
      piVar6 = i;
      break;
    case '_':
    case 'u':
      i = piVar6;
      fl_color(local_60);
      fl_line(W_local + 3,H_local + (int)l + -1,W_local + (int)e + -3,H_local + (int)l + -1);
      piVar6 = i;
      break;
    case 'b':
      talign = talign | 1;
      break;
    case 'c':
      local_64 = 0;
      break;
    case 'f':
    case 't':
      talign = 4;
      break;
    case 'i':
      talign = talign | 2;
      break;
    case 'r':
      local_64 = 8;
      break;
    case 's':
      lcol = 0xb;
    }
    i = piVar6;
  } while( true );
switchD_001d48b3_caseD_2e:
  i = piVar6;
LAB_001d4ac4:
  fl_font(talign,lcol);
  if ((str[0x22] & 1U) != 0) {
    bg = Fl_Widget::selection_color((Fl_Widget *)this);
    local_60 = fl_contrast(local_60,bg);
  }
  iVar5 = Fl_Widget::active_r((Fl_Widget *)this);
  if (iVar5 == 0) {
    local_60 = fl_inactive(local_60);
  }
  fl_color(local_60);
  if (_tsize == (char *)0x0) {
    local_bc = local_64;
  }
  else {
    local_bc = local_64 | 0x40;
  }
  fl_draw((char *)i,W_local + 3,H_local,(int)e + -6,(int)l,local_bc,(Fl_Image *)0x0,0);
  if (_tsize == (char *)0x0) {
    return;
  }
  cVar3 = column_char(this);
  *_tsize = cVar3;
  W_local = (int)e + W_local;
  l._4_4_ = l._4_4_ - (int)e;
  i = (int *)(_tsize + 1);
  goto LAB_001d471a;
}

Assistant:

void Fl_Browser::item_draw(void* item, int X, int Y, int W, int H) const {
  FL_BLINE* l = (FL_BLINE*)item;
  char* str = l->txt;
  const int* i = column_widths();

  bool first = true;	// for icon
  while (W > 6) {	// do each tab-separated field
    int w1 = W;	// width for this field
    char* e = 0; // pointer to end of field or null if none
    if (*i) { // find end of field and temporarily replace with 0
      e = strchr(str, column_char());
      if (e) {*e = 0; w1 = *i++;}
    }
    // Icon drawing code
    if (first) {
      first = false;
      if (l->icon) {
	l->icon->draw(X+2,Y+1);	// leave 2px left, 1px above
	int iconw = l->icon->w()+2;
	X += iconw; W -= iconw; w1 -= iconw;
      }
    }
    int tsize = textsize();
    Fl_Font font = textfont();
    Fl_Color lcol = textcolor();
    Fl_Align talign = FL_ALIGN_LEFT;
    // check for all the @-lines recognized by XForms:
    //#if defined(__GNUC__)
    //#warning FIXME This maybe needs to be more UTF8 aware now...?
    //#endif /*__GNUC__*/
    while (*str == format_char() && *++str && *str != format_char()) {
      switch (*str++) {
      case 'l': case 'L': tsize = 24; break;
      case 'm': case 'M': tsize = 18; break;
      case 's': tsize = 11; break;
      case 'b': font = (Fl_Font)(font|FL_BOLD); break;
      case 'i': font = (Fl_Font)(font|FL_ITALIC); break;
      case 'f': case 't': font = FL_COURIER; break;
      case 'c': talign = FL_ALIGN_CENTER; break;
      case 'r': talign = FL_ALIGN_RIGHT; break;
      case 'B': 
	if (!(l->flags & SELECTED)) {
	  fl_color((Fl_Color)strtol(str, &str, 10));
	  fl_rectf(X, Y, w1, H);
	} else while (isdigit(*str & 255)) str++; // skip digits
        break;
      case 'C':
	lcol = (Fl_Color)strtol(str, &str, 10);
	break;
      case 'F':
	font = (Fl_Font)strtol(str, &str, 10);
	break;
      case 'N':
	lcol = FL_INACTIVE_COLOR;
	break;
      case 'S':
	tsize = strtol(str, &str, 10);
	break;
      case '-':
	fl_color(FL_DARK3);
	fl_line(X+3, Y+H/2, X+w1-3, Y+H/2);
	fl_color(FL_LIGHT3);
	fl_line(X+3, Y+H/2+1, X+w1-3, Y+H/2+1);
	break;
      case 'u':
      case '_':
	fl_color(lcol);
	fl_line(X+3, Y+H-1, X+w1-3, Y+H-1);
	break;
      case '.':
	goto BREAK;
      case '@':
	str--; goto BREAK;
      }
    }
  BREAK:
    fl_font(font, tsize);
    if (l->flags & SELECTED)
      lcol = fl_contrast(lcol, selection_color());
    if (!active_r()) lcol = fl_inactive(lcol);
    fl_color(lcol);
    fl_draw(str, X+3, Y, w1-6, H, e ? Fl_Align(talign|FL_ALIGN_CLIP) : talign, 0, 0);
    if (!e) break; // no more fields...
    *e = column_char(); // put the separator back
    X += w1;
    W -= w1;
    str = e+1;
  }
}